

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O0

QString * __thiscall
SecurityDirWrapper::translateType(QString *__return_storage_ptr__,SecurityDirWrapper *this,int type)

{
  int type_local;
  SecurityDirWrapper *this_local;
  
  switch(type) {
  case 1:
    QString::QString(__return_storage_ptr__,"X.509 certificate");
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"PKCS Signed Data");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"Reserved");
    break;
  default:
    QString::QString(__return_storage_ptr__,"");
    break;
  case 9:
    QString::QString(__return_storage_ptr__,"PKCS1 Module Sign Fields");
  }
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateType(int type)
{
    switch (type) {
        case pe::WIN_CERT_TYPE_X509  : return "X.509 certificate";
        case pe::WIN_CERT_TYPE_PKCS_SIGNED_DATA : return "PKCS Signed Data";
        case pe::WIN_CERT_TYPE_RESERVED_1 : return "Reserved";
        case pe::WIN_CERT_TYPE_PKCS1_SIGN : return "PKCS1 Module Sign Fields";
    }
    return "";
}